

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

bool __thiscall Character::DelSpell(Character *this,short spell)

{
  _List_node_base *p_Var1;
  const_iterator __first;
  list<Character_Spell,_std::allocator<Character_Spell>_> *__last;
  
  __last = &this->spells;
  for (__first._M_node =
            (this->spells).super__List_base<Character_Spell,_std::allocator<Character_Spell>_>.
            _M_impl._M_node.super__List_node_base._M_next;
      (__first._M_node != (_List_node_base *)__last &&
      (*(short *)&__first._M_node[1]._M_next != spell));
      __first._M_node = (__first._M_node)->_M_next) {
  }
  if (__first._M_node != (_List_node_base *)__last) {
    for (p_Var1 = (__first._M_node)->_M_next; p_Var1 != (_List_node_base *)__last;
        p_Var1 = p_Var1->_M_next) {
      if (*(short *)&p_Var1[1]._M_next != spell) {
        *(undefined1 *)((long)&__first._M_node[1]._M_next + 2) =
             *(undefined1 *)((long)&p_Var1[1]._M_next + 2);
        *(undefined2 *)&__first._M_node[1]._M_next = *(undefined2 *)&p_Var1[1]._M_next;
        __first._M_node = (__first._M_node)->_M_next;
      }
    }
  }
  std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::erase
            (__last,__first,(const_iterator)__last);
  CheckQuestRules(this);
  return __first._M_node != (_List_node_base *)__last;
}

Assistant:

bool Character::DelSpell(short spell)
{
	auto remove_it = std::remove_if(UTIL_RANGE(this->spells), [&](Character_Spell cs) { return cs.id == spell; });
	bool removed = (remove_it != this->spells.end());
	this->spells.erase(remove_it, this->spells.end());

	this->CheckQuestRules();

	return removed;
}